

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_eigen.hpp
# Opt level: O2

Tensor<1> Omega_h::exp_spd_old<1>(Tensor<1> m)

{
  Tensor<1> TVar1;
  double dVar2;
  double dVar3;
  
  dVar3 = ABS((double)m.super_Few<Omega_h::Vector<1>,_1>.array_[0].super_Few<double,_1>.array_[0]);
  dVar2 = 0.0;
  if (dVar3 <= 0.0) {
    dVar3 = 0.0;
  }
  if (1e-10 < dVar3) {
    dVar2 = (double)m.super_Few<Omega_h::Vector<1>,_1>.array_[0].super_Few<double,_1>.array_[0] /
            dVar3;
    if ((1e-10 < ABS(dVar2)) && (1e-10 < ABS((dVar2 - dVar2) / dVar2))) {
      fail("assertion %s failed at %s +%d\n","are_close(roots[0], m[0][0])",
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_eigen.hpp"
           ,0x123);
    }
    dVar2 = dVar3 * dVar2;
  }
  TVar1.super_Few<Omega_h::Vector<1>,_1>.array_[0].super_Few<double,_1>.array_[0] =
       (Few<Omega_h::Vector<1>,_1>)exp(dVar2);
  return (Tensor<1>)TVar1.super_Few<Omega_h::Vector<1>,_1>.array_[0].super_Few<double,_1>.array_[0];
}

Assistant:

OMEGA_H_INLINE_BIG Tensor<dim> exp_spd_old(
    Tensor<dim> const m) OMEGA_H_NOEXCEPT {
  auto decomp = decompose_eigen(m);
  for (Int i = 0; i < dim; ++i) decomp.l[i] = std::exp(decomp.l[i]);
  return compose_ortho(decomp.q, decomp.l);
}